

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::ReduceSumSquareLayerParams::New
          (ReduceSumSquareLayerParams *this,Arena *arena)

{
  ReduceSumSquareLayerParams *this_00;
  
  this_00 = (ReduceSumSquareLayerParams *)operator_new(0x30);
  ReduceSumSquareLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReduceSumSquareLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReduceSumSquareLayerParams* ReduceSumSquareLayerParams::New(::google::protobuf::Arena* arena) const {
  ReduceSumSquareLayerParams* n = new ReduceSumSquareLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}